

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void MapOptHandler_skyrotate2(FMapInfoParser *parse,level_info_t *info)

{
  FGLROptions *pFVar1;
  FName local_1c;
  
  local_1c.Index = FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pFVar1 = level_info_t::GetOptData<FGLROptions>(info,&local_1c,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector2).X = (float)(parse->sc).Float;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,",");
  }
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector2).Y = (float)(parse->sc).Float;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,",");
  }
  FScanner::MustGetFloat(&parse->sc);
  (pFVar1->skyrotatevector2).Z = (float)(parse->sc).Float;
  TVector3<float>::MakeUnit(&pFVar1->skyrotatevector2);
  return;
}

Assistant:

DEFINE_MAP_OPTION(skyrotate2, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");

	parse.ParseAssign();
	parse.sc.MustGetFloat();
	opt->skyrotatevector2.X = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector2.Y = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector2.Z = (float)parse.sc.Float;
	opt->skyrotatevector2.MakeUnit();
}